

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O1

int CfdCreateConfidentialAddress
              (void *handle,char *address,char *confidential_key,char **confidential_address)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Pubkey key;
  ElementsAddressFactory factory;
  ElementsConfidentialAddress confidential_addr;
  Address addr;
  Pubkey local_560;
  AddressFactory local_548;
  undefined1 local_520 [384];
  pointer local_3a0;
  pointer local_390;
  _Alloc_hider local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  undefined1 local_368 [384];
  pointer local_1e8;
  pointer local_1d8;
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  Address local_1b0;
  
  cfd::Initialize();
  if (confidential_address == (char **)0x0) {
    local_520._0_8_ = "cfdcapi_elements_address.cpp";
    local_520._8_4_ = 0x49;
    local_520._16_8_ = "CfdCreateConfidentialAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_520,kCfdLogLevelWarning,"confidential address is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_520._0_8_ = local_520 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_520,"Failed to parameter. confidential address is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_520);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(address);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(confidential_key);
    if (!bVar1) {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_548);
      std::__cxx11::string::string((string *)local_520,address,(allocator *)local_368);
      cfd::AddressFactory::GetAddress(&local_1b0,&local_548,(string *)local_520);
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
      }
      std::__cxx11::string::string((string *)local_520,confidential_key,(allocator *)local_368);
      cfd::core::Pubkey::Pubkey(&local_560,(string *)local_520);
      if ((undefined1 *)local_520._0_8_ != local_520 + 0x10) {
        operator_delete((void *)local_520._0_8_,local_520._16_8_ + 1);
      }
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_520);
      cfd::ElementsAddressFactory::GetConfidentialAddress
                ((ElementsConfidentialAddress *)local_368,&local_1b0,&local_560);
      cfd::core::ElementsConfidentialAddress::operator=
                ((ElementsConfidentialAddress *)local_520,(ElementsConfidentialAddress *)local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_p != &local_1c0) {
        operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
      }
      if (local_1e8 != (pointer)0x0) {
        operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
      }
      cfd::core::Address::~Address((Address *)local_368);
      cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
                ((string *)local_368,(ElementsConfidentialAddress *)local_520);
      pcVar2 = cfd::capi::CreateString((string *)local_368);
      *confidential_address = pcVar2;
      if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
        operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_p != &local_378) {
        operator_delete(local_388._M_p,local_378._M_allocated_capacity + 1);
      }
      if (local_3a0 != (pointer)0x0) {
        operator_delete(local_3a0,(long)local_390 - (long)local_3a0);
      }
      cfd::core::Address::~Address((Address *)local_520);
      if (local_560.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_560.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_560.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_560.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      cfd::core::Address::~Address(&local_1b0);
      local_548._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0087aa98;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_548.prefix_list_);
      return 0;
    }
    local_520._0_8_ = "cfdcapi_elements_address.cpp";
    local_520._8_4_ = 0x55;
    local_520._16_8_ = "CfdCreateConfidentialAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_520,kCfdLogLevelWarning,
               "confidential key is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_520._0_8_ = local_520 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_520,"Failed to parameter. confidential key is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_520);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_520._0_8_ = "cfdcapi_elements_address.cpp";
  local_520._8_4_ = 0x4f;
  local_520._16_8_ = "CfdCreateConfidentialAddress";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_520,kCfdLogLevelWarning,"address is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_520._0_8_ = local_520 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_520,"Failed to parameter. address is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_520);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateConfidentialAddress(
    void* handle, const char* address, const char* confidential_key,
    char** confidential_address) {
  try {
    cfd::Initialize();
    if (confidential_address == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null.");
    }
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null or empty.");
    }
    if (IsEmptyString(confidential_key)) {
      warn(CFD_LOG_SOURCE, "confidential key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null or empty.");
    }

    ElementsAddressFactory factory;
    Address addr = factory.GetAddress(address);
    Pubkey key = Pubkey(confidential_key);

    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(addr, key);
    *confidential_address = CreateString(confidential_addr.GetAddress());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}